

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O2

QByteArray *
xxflate(QByteArray *__return_storage_ptr__,ZLibOp op,QArrayDataPointer<char> *out,
       QByteArrayView input,function_ref<int_(z_stream_s_*)_const> init,
       function_ref<int_(z_stream_s_*,_unsigned_long)_const> processChunk,
       function_ref<void_(z_stream_s_*)_const> deinit)

{
  int iVar1;
  char *pcVar2;
  ulong uVar3;
  long lVar4;
  qsizetype qVar5;
  ulong args_1;
  long in_FS_OFFSET;
  z_stream_s local_c0;
  QScopeGuard<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_qt[P]qtbase_src_corelib_text_qbytearray_cpp:623:33)>
  local_50;
  long local_38;
  
  args_1 = input.m_size;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (out->ptr == (char *)0x0) {
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      tooMuchData(__return_storage_ptr__,op);
      return __return_storage_ptr__;
    }
    goto LAB_002d0c1a;
  }
  if (out->d == (Data *)0x0) {
    qVar5 = 0;
  }
  else {
    qVar5 = (out->d->super_QArrayData).alloc;
  }
  local_c0.data_type = 0;
  local_c0._92_4_ = 0;
  local_c0.adler = 0;
  local_c0.zfree = (free_func)0x0;
  local_c0.opaque = (voidpf)0x0;
  local_c0.state = (internal_state *)0x0;
  local_c0.zalloc = (alloc_func)0x0;
  local_c0.total_out = 0;
  local_c0.msg = (char *)0x0;
  local_c0.next_out = (Bytef *)0x0;
  local_c0._32_8_ = 0;
  local_c0.avail_in = 0;
  local_c0._12_4_ = 0;
  local_c0.total_in = 0;
  local_c0.reserved = 0;
  local_c0.next_in = (Bytef *)input.m_data;
  local_50.m_func.deinit = (function_ref<void_(z_stream_s_*)_const> *)&local_c0;
  iVar1 = (*init.super_function_ref_base<false,_const_void,_int,_z_stream_s_*>.m_thunk_ptr)
                    (init.super_function_ref_base<false,_const_void,_int,_z_stream_s_*>.
                     m_bound_entity,(z_stream_s **)&local_50);
  if (iVar1 == 0) {
    local_50.m_func.deinit = &deinit;
    local_50.m_invoke = true;
    local_50._17_7_ = 0xaaaaaaaaaaaaaa;
    local_50.m_func.zs = &local_c0;
switchD_002d0aeb_caseD_0:
    if (local_c0.avail_out == 0) {
      lVar4 = out->size;
      uVar3 = qVar5 - lVar4;
      if (uVar3 == 0) {
        QArrayDataPointer<char>::reallocateAndGrow(out,GrowsAtEnd,1,(QArrayDataPointer<char> *)0x0);
        pcVar2 = out->ptr;
        if (pcVar2 == (char *)0x0) {
          tooMuchData(__return_storage_ptr__,op);
          goto LAB_002d0b53;
        }
        if (out->d == (Data *)0x0) {
          qVar5 = 0;
        }
        else {
          qVar5 = (out->d->super_QArrayData).alloc;
        }
        lVar4 = out->size;
        uVar3 = qVar5 - lVar4;
      }
      else {
        pcVar2 = out->ptr;
      }
      local_c0.next_out = (Bytef *)(pcVar2 + lVar4);
      if (0xfffffffe < uVar3) {
        uVar3 = 0xffffffff;
      }
      local_c0.avail_out = (int)uVar3;
      out->size = uVar3 + lVar4;
    }
    if (local_c0.avail_in == 0) {
      uVar3 = 0xffffffff;
      if (args_1 < 0xffffffff) {
        uVar3 = args_1;
      }
      local_c0.avail_in = (uInt)uVar3;
      args_1 = args_1 - uVar3;
    }
    iVar1 = qxp::detail::function_ref_base<false,_const_void,_int,_z_stream_s_*,_unsigned_long>::
            operator()(&processChunk.
                        super_function_ref_base<false,_const_void,_int,_z_stream_s_*,_unsigned_long>
                       ,&local_c0,args_1);
    switch(iVar1) {
    case 0:
      goto switchD_002d0aeb_caseD_0;
    case 1:
      lVar4 = out->size - (local_c0._32_8_ & 0xffffffff);
      out->size = lVar4;
      out->ptr[lVar4] = '\0';
      QArrayDataPointer<char>::QArrayDataPointer(&__return_storage_ptr__->d,out);
      goto LAB_002d0b53;
    case -4:
      goto switchD_002d0aeb_caseD_fffffffc;
    case -3:
      invalidCompressedData();
      goto LAB_002d0b53;
    default:
      unexpectedZlibError(__return_storage_ptr__,op,iVar1,local_c0.msg);
      goto LAB_002d0b53;
    }
  }
  unexpectedZlibError(__return_storage_ptr__,op,iVar1,local_c0.msg);
  goto LAB_002d0b60;
switchD_002d0aeb_caseD_fffffffc:
  tooMuchData(__return_storage_ptr__,op);
LAB_002d0b53:
  QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/text/qbytearray.cpp:623:33)>
  ::~QScopeGuard(&local_50);
LAB_002d0b60:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_002d0c1a:
  __stack_chk_fail();
}

Assistant:

static QByteArray xxflate(ZLibOp op, QArrayDataPointer<char> out, QByteArrayView input,
                          qxp::function_ref<int(z_stream *) const> init,
                          qxp::function_ref<int(z_stream *, size_t) const> processChunk,
                          qxp::function_ref<void(z_stream *) const> deinit)
{
    if (out.data() == nullptr) // allocation failed
        return tooMuchData(op);
    qsizetype capacity = out.allocatedCapacity();

    const auto initalSize = out.size;

    z_stream zs = {};
    zs.next_in = reinterpret_cast<uchar *>(const_cast<char *>(input.data())); // 1980s C API...
    if (const int err = init(&zs); err != Z_OK)
        return unexpectedZlibError(op, err, zs.msg);
    const auto sg = qScopeGuard([&] { deinit(&zs); });

    using ZlibChunkSize_t = decltype(zs.avail_in);
    static_assert(!std::is_signed_v<ZlibChunkSize_t>);
    static_assert(std::is_same_v<ZlibChunkSize_t, decltype(zs.avail_out)>);
    constexpr auto MaxChunkSize = std::numeric_limits<ZlibChunkSize_t>::max();
    [[maybe_unused]]
    constexpr auto MaxStatisticsSize = std::numeric_limits<decltype(zs.total_out)>::max();

    size_t inputLeft = size_t(input.size());

    int res;
    do {
        Q_ASSERT(out.freeSpaceAtBegin() == 0); // ensure prepend optimization stays out of the way
        Q_ASSERT(capacity == out.allocatedCapacity());

        if (zs.avail_out == 0) {
            Q_ASSERT(size_t(out.size) - initalSize > MaxStatisticsSize || // total_out overflow
                     size_t(out.size) - initalSize == zs.total_out);
            Q_ASSERT(out.size <= capacity);

            qsizetype avail_out = capacity - out.size;
            if (avail_out == 0) {
                out->reallocateAndGrow(QArrayData::GrowsAtEnd, 1); // grow to next natural capacity
                if (out.data() == nullptr) // reallocation failed
                    return tooMuchData(op);
                capacity = out.allocatedCapacity();
                avail_out = capacity - out.size;
            }
            zs.next_out = reinterpret_cast<uchar *>(out.data()) + out.size;
            zs.avail_out = size_t(avail_out) > size_t(MaxChunkSize) ? MaxChunkSize
                                                                    : ZlibChunkSize_t(avail_out);
            out.size += zs.avail_out;

            Q_ASSERT(zs.avail_out > 0);
        }

        if (zs.avail_in == 0) {
            // zs.next_in is kept up-to-date by processChunk(), so nothing to do
            zs.avail_in = inputLeft > MaxChunkSize ? MaxChunkSize : ZlibChunkSize_t(inputLeft);
            inputLeft -= zs.avail_in;
        }

        res = processChunk(&zs, inputLeft);
    } while (res == Z_OK);

    switch (res) {
    case Z_STREAM_END:
        out.size -= zs.avail_out;
        Q_ASSERT(size_t(out.size) - initalSize > MaxStatisticsSize || // total_out overflow
                 size_t(out.size) - initalSize == zs.total_out);
        Q_ASSERT(out.size <= out.allocatedCapacity());
        out.data()[out.size] = '\0';
        return QByteArray(std::move(out));

    case Z_MEM_ERROR:
        return tooMuchData(op);

    case Z_BUF_ERROR:
        Q_UNREACHABLE(); // cannot happen - we supply a buffer that can hold the result,
                         // or else error out early

    case Z_DATA_ERROR:   // can only happen on decompression
        Q_ASSERT(op == ZLibOp::Decompression);
        return invalidCompressedData();

    default:
        return unexpectedZlibError(op, res, zs.msg);
    }
}